

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O1

void Imf_3_2::(anonymous_namespace)::
     readStringList<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
               (char **readPtr,char *endPtr,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *outputVector,int numberOfStrings)

{
  char *pcVar1;
  const_iterator __position;
  uint64_t uVar2;
  InputExc *pIVar3;
  undefined4 in_register_0000000c;
  long lVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> lengths;
  int local_6c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  value_type local_50;
  
  local_6c = 0;
  if (endPtr < *readPtr + 4) {
    pIVar3 = (InputExc *)
             __cxa_allocate_exception
                       (0x48,endPtr,outputVector,CONCAT44(in_register_0000000c,numberOfStrings));
    Iex_3_2::InputExc::InputExc(pIVar3,"IDManifest too small for string list size");
    __cxa_throw(pIVar3,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
  }
  Xdr::read<Imf_3_2::CharPtrIO,char_const*>(readPtr,&local_6c);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_68,(long)local_6c,(allocator_type *)&local_50);
  if (0 < local_6c) {
    lVar4 = 0;
    do {
      uVar2 = anon_unknown_4::readVariableLengthInteger(readPtr,endPtr);
      local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[lVar4] = uVar2;
      lVar4 = lVar4 + 1;
    } while (lVar4 < local_6c);
  }
  if (0 < local_6c) {
    lVar4 = 0;
    do {
      pcVar1 = *readPtr;
      if (endPtr < pcVar1 + local_68.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar4]) {
        pIVar3 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::InputExc::InputExc(pIVar3,"IDManifest too small for string");
        __cxa_throw(pIVar3,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
      }
      __position._M_current =
           (outputVector->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,pcVar1,
                 pcVar1 + local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar4]);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_insert_rval(outputVector,__position,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      *readPtr = *readPtr +
                 local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 < local_6c);
  }
  if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
readStringList (
    const char*& readPtr,
    const char*  endPtr,
    T&           outputVector,
    int          numberOfStrings = 0)
{
    if (numberOfStrings == 0)
    {
        if (readPtr + 4 > endPtr)
        {
            throw IEX_NAMESPACE::InputExc (
                "IDManifest too small for string list size");
        }
        Xdr::read<CharPtrIO> (readPtr, numberOfStrings);
    }

    vector<size_t> lengths (numberOfStrings);

    for (int i = 0; i < numberOfStrings; ++i)
    {
        lengths[i] = readVariableLengthInteger (readPtr, endPtr);
    }
    for (int i = 0; i < numberOfStrings; ++i)
    {

        if (readPtr + lengths[i] > endPtr)
        {
            throw IEX_NAMESPACE::InputExc ("IDManifest too small for string");
        }
        outputVector.insert (outputVector.end (), string (readPtr, lengths[i]));
        readPtr += lengths[i];
    }
}